

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O1

void av1_compute_global_motion_facade(AV1_COMP *cpi)

{
  WarpedMotionParams *pWVar1;
  FrameDistPair *pFVar2;
  int32_t *piVar3;
  _Bool _Var4;
  byte bVar5;
  GM_SEARCH_TYPE GVar6;
  uint uVar7;
  AV1_PRIMARY *pAVar8;
  YV12_BUFFER_CONFIG *pYVar9;
  RefCntBuffer *pRVar10;
  GlobalMotionData *pGVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  uint8_t *puVar14;
  int *piVar15;
  int i;
  int iVar16;
  long lVar17;
  RefCntBuffer *pRVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int ref_frame_list [2];
  uint local_60 [4];
  FrameDistPair (*local_50) [7];
  int *local_48;
  FrameDistPair (*local_40) [7];
  int *local_38;
  long lVar24;
  
  auVar12 = _DAT_004d2ad0;
  _Var4 = (cpi->oxcf).tool_cfg.enable_global_motion;
  if ((_Var4 == true) && (cpi->gf_frame_index == '\0')) {
    pAVar8 = cpi->ppi;
    lVar17 = 0;
    auVar23 = _DAT_004d2ab0;
    auVar25 = _DAT_004d2ac0;
    do {
      auVar26 = auVar25 ^ auVar12;
      if (auVar26._4_4_ == -0x80000000 && auVar26._0_4_ < -0x7ffffff9) {
        pAVar8->valid_gm_model_found[lVar17] = 0x7fffffff;
        pAVar8->valid_gm_model_found[lVar17 + 1] = 0x7fffffff;
      }
      auVar26 = auVar23 ^ auVar12;
      if (auVar26._4_4_ == -0x80000000 && auVar26._0_4_ < -0x7ffffff9) {
        pAVar8->valid_gm_model_found[lVar17 + 2] = 0x7fffffff;
        pAVar8->valid_gm_model_found[lVar17 + 3] = 0x7fffffff;
      }
      lVar17 = lVar17 + 4;
      lVar24 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar24 + 4;
      lVar24 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar24 + 4;
    } while (lVar17 != 8);
  }
  if (((((cpi->common).current_frame.frame_type == '\x01') &&
       (pYVar9 = cpi->source, pYVar9 != (YV12_BUFFER_CONFIG *)0x0 && _Var4 == true)) &&
      ((cpi->gm_info).search_done == false)) && ((cpi->sf).gm_sf.gm_search_type != '\x04')) {
    (cpi->gm_info).segment_map_w = (pYVar9->field_2).field_0.y_crop_width + 0x1f >> 5;
    (cpi->gm_info).segment_map_h = (pYVar9->field_3).field_0.y_crop_height + 0x1f >> 5;
    (cpi->gm_info).reference_frames[0][0].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][0].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][1].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][1].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][2].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][2].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][3].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][3].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][4].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][4].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][5].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][5].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][6].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][6].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][0].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][0].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][1].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][1].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][2].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][2].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][3].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][3].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][4].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][4].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][5].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][5].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][6].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][6].frame = 0xffffffff;
    (cpi->gm_info).num_ref_frames[0] = 0;
    (cpi->gm_info).num_ref_frames[1] = 0;
    pAVar8 = cpi->ppi;
    if ((cpi->sf).inter_sf.selective_ref_frame < 1) {
      bVar13 = true;
    }
    else {
      bVar5 = (pAVar8->gf_group).update_type[cpi->gf_frame_index];
      bVar13 = bVar5 == 0 || (bVar5 & 0xfe) == 2;
    }
    if ((((cpi->sf).gm_sf.disable_gm_search_based_on_stats == 0) ||
        ((pAVar8->gf_group).arf_index < 0)) ||
       ((pAVar8->valid_gm_model_found[3] != 0 || (pAVar8->valid_gm_model_found[6] != 0)))) {
      bVar22 = false;
    }
    else {
      bVar22 = pAVar8->valid_gm_model_found[1] == 0;
    }
    local_50 = (cpi->gm_info).reference_frames;
    local_48 = (cpi->gm_info).num_ref_frames;
    local_38 = (cpi->gm_info).num_ref_frames + 1;
    local_60[3] = ((cpi->common).cur_frame)->pyramid_level;
    local_40 = (cpi->gm_info).reference_frames + 1;
    uVar19 = 7;
    do {
      iVar20 = -1;
      if ((byte)((char)uVar19 - 1U) < 8) {
        iVar20 = (cpi->common).remapped_ref_idx[uVar19 - 1];
      }
      if (iVar20 == -1) {
        pRVar18 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar18 = (cpi->common).ref_frame_map[iVar20];
      }
      uVar7 = cpi->ref_frame_flags;
      bVar5 = ""[uVar19];
      (cpi->gm_info).ref_buf[uVar19] = (YV12_BUFFER_CONFIG *)0x0;
      piVar3 = (cpi->common).global_motion[uVar19].wmmat + 4;
      piVar3[0] = 0;
      piVar3[1] = 0x10000;
      *(undefined8 *)(piVar3 + 2) = 0;
      pWVar1 = (cpi->common).global_motion + uVar19;
      pWVar1->wmmat[0] = 0;
      pWVar1->wmmat[1] = 0;
      pWVar1->wmmat[2] = 0x10000;
      pWVar1->wmmat[3] = 0;
      pWVar1 = (cpi->common).global_motion + uVar19;
      pWVar1->wmtype = '\0';
      pWVar1->invalid = '\0';
      *(undefined2 *)&pWVar1->field_0x22 = 0;
      if ((pRVar18 != (RefCntBuffer *)0x0) &&
         (((uVar7 & bVar5) != 0 || ((cpi->sf).hl_sf.recode_loop == '\0')))) {
        (cpi->gm_info).ref_buf[uVar19] = &pRVar18->buf;
        if ((bVar13) || (iVar20 = (cpi->sf).inter_sf.selective_ref_frame, iVar20 == 0)) {
LAB_001d181e:
          bVar5 = 0;
        }
        else {
          pRVar10 = (cpi->common).cur_frame;
          if (iVar20 < 2) {
LAB_001d17c7:
            if (2 < iVar20) {
              local_60[0] = 6;
              local_60[1] = 5;
              bVar21 = true;
              lVar17 = 0;
              do {
                uVar7 = local_60[lVar17];
                if ((((ulong)uVar7 != 0xffffffff) &&
                    ((long)(uVar19 << 0x18) >> 0x18 == (ulong)uVar7)) &&
                   ((int)pRVar10->ref_display_order_hint[(long)(int)uVar7 + -1] <
                    (int)pRVar10->ref_display_order_hint[0])) break;
                lVar17 = lVar17 + 1;
                bVar21 = lVar17 == 1;
              } while (bVar21);
              bVar5 = 1;
              if (bVar21) goto LAB_001d1821;
            }
            goto LAB_001d181e;
          }
          local_60[0] = 3;
          local_60[1] = 2;
          bVar21 = true;
          lVar17 = 0;
          do {
            uVar7 = local_60[lVar17];
            if ((((ulong)uVar7 != 0xffffffff) && ((long)(uVar19 << 0x18) >> 0x18 == (ulong)uVar7))
               && ((int)pRVar10->ref_display_order_hint[(long)(int)uVar7 + -1] <
                   (int)pRVar10->ref_display_order_hint[3])) break;
            lVar17 = lVar17 + 1;
            bVar21 = lVar17 == 1;
          } while (bVar21);
          bVar5 = 1;
          if (!bVar21) goto LAB_001d17c7;
        }
LAB_001d1821:
        if (((pRVar18->buf).field_2.field_0.y_crop_width ==
             (cpi->source->field_2).field_0.y_crop_width) &&
           ((pRVar18->buf).field_3.field_0.y_crop_height ==
            (cpi->source->field_3).field_0.y_crop_height)) {
          GVar6 = (cpi->sf).gm_sf.gm_search_type;
          if (GVar6 == '\x04') {
            bVar21 = false;
          }
          else if (GVar6 == '\x02') {
            bVar21 = uVar19 != 6 && ((uint)uVar19 & 0x7ffffffe) != 2;
          }
          else {
            bVar21 = true;
            if (GVar6 == '\x01') {
              bVar21 = ((uint)uVar19 & 0x7ffffffe) != 2;
            }
          }
          if (!(bool)(bVar5 | ~bVar21 & 1U | bVar22 | (int)local_60[3] < (int)pRVar18->pyramid_level
                     )) {
            iVar20 = pRVar18->display_order_hint - ((cpi->common).cur_frame)->display_order_hint;
            if (iVar20 != 0) {
              if (iVar20 < 0) {
                (*local_50)[*local_48].distance = -iVar20;
                iVar16 = *local_48;
                pFVar2 = *local_50 + iVar16;
                piVar15 = local_48;
              }
              else {
                iVar16 = *local_38;
                pFVar2 = *local_40 + iVar16;
                pFVar2->distance = iVar20;
                piVar15 = local_38;
              }
              pFVar2->frame = (char)uVar19;
              *piVar15 = iVar16 + 1;
            }
          }
        }
      }
      bVar21 = 1 < uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar21);
    qsort(local_50,(long)(cpi->gm_info).num_ref_frames[0],8,compare_distance);
    qsort(local_40,(long)(cpi->gm_info).num_ref_frames[1],8,compare_distance);
    if ((cpi->sf).gm_sf.gm_search_type == '\x03') {
      iVar20 = *local_48;
      if (*local_38 < 1) {
        iVar16 = 2;
        if (iVar20 < 2) {
          iVar16 = iVar20;
        }
        *local_48 = iVar16;
      }
      else {
        iVar16 = 1;
        if (iVar20 < 1) {
          iVar16 = iVar20;
        }
        *local_48 = iVar16;
        *local_38 = 1;
      }
    }
    if ((*local_48 != 0) || (*local_38 != 0)) {
      puVar14 = (uint8_t *)
                aom_malloc((long)(cpi->gm_info).segment_map_h * (long)(cpi->gm_info).segment_map_w);
      (cpi->td).gm_data.segment_map = puVar14;
      if (puVar14 == (uint8_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_data->segment_map");
      }
      (cpi->td).gm_data.motion_models[0].inliers = (int *)0x0;
      (cpi->td).gm_data.motion_models[0].num_inliers = 0;
      *(undefined4 *)&(cpi->td).gm_data.motion_models[0].field_0x3c = 0;
      pGVar11 = &(cpi->td).gm_data;
      pGVar11->motion_models[0].params[4] = 0.0;
      pGVar11->motion_models[0].params[5] = 0.0;
      pGVar11 = &(cpi->td).gm_data;
      pGVar11->motion_models[0].params[2] = 0.0;
      pGVar11->motion_models[0].params[3] = 0.0;
      (cpi->td).gm_data.motion_models[0].params[0] = 0.0;
      (cpi->td).gm_data.motion_models[0].params[1] = 0.0;
      piVar15 = (int *)aom_malloc(0x8000);
      (cpi->td).gm_data.motion_models[0].inliers = piVar15;
      if (piVar15 == (int *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_data->motion_models[m].inliers");
      }
      if ((cpi->mt_info).num_workers < 2) {
        global_motion_estimation(cpi);
      }
      else {
        av1_global_motion_estimation_mt(cpi);
      }
      aom_free((cpi->td).gm_data.segment_map);
      (cpi->td).gm_data.segment_map = (uint8_t *)0x0;
      aom_free((cpi->td).gm_data.motion_models[0].inliers);
      (cpi->td).gm_data.motion_models[0].inliers = (int *)0x0;
      (cpi->gm_info).search_done = true;
    }
  }
  memcpy(((cpi->common).cur_frame)->global_motion,(cpi->common).global_motion,0x120);
  return;
}

Assistant:

void av1_compute_global_motion_facade(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  GlobalMotionInfo *const gm_info = &cpi->gm_info;

  if (cpi->oxcf.tool_cfg.enable_global_motion) {
    if (cpi->gf_frame_index == 0) {
      for (int i = 0; i < FRAME_UPDATE_TYPES; i++) {
        cpi->ppi->valid_gm_model_found[i] = INT32_MAX;
#if CONFIG_FPMT_TEST
        if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
          cpi->ppi->temp_valid_gm_model_found[i] = INT32_MAX;
#endif
      }
    }
  }

  if (cpi->common.current_frame.frame_type == INTER_FRAME && cpi->source &&
      cpi->oxcf.tool_cfg.enable_global_motion && !gm_info->search_done &&
      cpi->sf.gm_sf.gm_search_type != GM_DISABLE_SEARCH) {
    setup_global_motion_info_params(cpi);
    // Terminate early if the total number of reference frames is zero.
    if (cpi->gm_info.num_ref_frames[0] || cpi->gm_info.num_ref_frames[1]) {
      gm_alloc_data(cpi, &cpi->td.gm_data);
      if (cpi->mt_info.num_workers > 1)
        av1_global_motion_estimation_mt(cpi);
      else
        global_motion_estimation(cpi);
      gm_dealloc_data(&cpi->td.gm_data);
      gm_info->search_done = 1;
    }
  }
  memcpy(cm->cur_frame->global_motion, cm->global_motion,
         sizeof(cm->cur_frame->global_motion));
}